

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

void __thiscall
Centaurus::LookaheadDFA<char>::fork_closures
          (LookaheadDFA<char> *this,CompositeATN<char> *catn,int index)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  pointer cc;
  CATNDepartureSet<char> deptset;
  CATNClosure ec;
  CATNDepartureSet<char> local_80;
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  local_60;
  
  CompositeATN<char>::build_departure_set
            (&local_80,catn,
             &(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
              super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
              ._M_impl.super__Vector_impl_data._M_start[index].
              super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
              .m_label);
  uVar3 = ((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  uVar2 = uVar3;
  if (local_80.
      super_vector<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
      .
      super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super_vector<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
      .
      super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cc = local_80.
         super_vector<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
         .
         super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = get_closure_color(&cc->second);
      if (iVar1 < 1) {
        CompositeATN<char>::build_closure((CATNClosure *)&local_60,catn,&cc->second);
        iVar1 = add_state(this,(CATNClosure *)&local_60);
        NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
        ::add_transition(&(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                          super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[index].
                          super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                         ,&cc->first,iVar1,false);
        std::
        _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
        ::~_Rb_tree(&local_60);
      }
      else {
        NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
        ::add_transition(&(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                          super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[index].
                          super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                         ,&cc->first,-iVar1,false);
      }
      cc = cc + 1;
    } while (cc != local_80.
                   super_vector<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                   .
                   super__Vector_base<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    uVar2 = ((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                   super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  }
  if ((uVar3 & 0xffffffff) < uVar2) {
    do {
      fork_closures(this,catn,(int)uVar3);
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar2 = ((long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                     super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
                     super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
    } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
  }
  std::
  vector<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ::~vector(&local_80.
             super_vector<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
           );
  return;
}

Assistant:

void fork_closures(const CompositeATN<TCHAR>& catn, int index)
	{
		const LDFAState<TCHAR>& state = m_states[index];

		//First, check if the state in question is already single-colored
		/*if (state.get_color() > 0)
		{
			std::cout << "Monochromatic " << index << std::endl;
			return;
		}*/

		CATNDepartureSet<TCHAR> deptset = catn.build_departure_set(state.label());

		/*std::wofstream deptsetLog("deptset.log", std::ios::app);

		deptsetLog << deptset << std::endl;

		deptsetLog.close();*/

		//std::cout << deptset << std::endl;

		//Add new states to the LDFA
		int initial_index = m_states.size();

		for (const auto& item : deptset)
		{
			int color = get_closure_color(item.second);

			if (color > 0)
			{
				m_states[index].add_transition(item.first, -color);
			}
			else
			{
				CATNClosure ec = catn.build_closure(item.second);

				int new_index = add_state(ec);

				m_states[index].add_transition(item.first, new_index);
			}
		}

		//Recursively construct the closures for all the newly added DFA states
		for (unsigned int i = initial_index; i < m_states.size(); i++)
		{
			fork_closures(catn, i);
		}
	}